

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShortcutsWindow.cpp
# Opt level: O3

void __thiscall cursespp::ShortcutsWindow::OnRedraw(ShortcutsWindow *this)

{
  undefined4 *puVar1;
  size_t __n;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  long *plVar4;
  pointer psVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  back_insert_iterator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  bVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  undefined8 uVar11;
  ulong uVar12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar13;
  wstring result;
  string value;
  string key;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  ShortcutsWindow *local_c8;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *local_c0;
  ulong local_b8;
  undefined1 local_b0 [32];
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  size_t local_70;
  long local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  ulong local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  Window::Clear(&this->super_Window);
  iVar2 = (*(this->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable[0x22])(this);
  local_70 = CalculateLeftPadding(this);
  local_68 = CONCAT44(extraout_var,iVar2);
  wmove(CONCAT44(extraout_var,iVar2),0,local_70 & 0xffffffff);
  local_c8 = this;
  iVar2 = (*(this->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable[0x19])(this);
  if ((iVar2 != 0) &&
     (psVar5 = (local_c8->entries).
               super__Vector_base<std::shared_ptr<cursespp::ShortcutsWindow::Entry>,_std::allocator<std::shared_ptr<cursespp::ShortcutsWindow::Entry>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
     (local_c8->entries).
     super__Vector_base<std::shared_ptr<cursespp::ShortcutsWindow::Entry>,_std::allocator<std::shared_ptr<cursespp::ShortcutsWindow::Entry>_>_>
     ._M_impl.super__Vector_impl_data._M_finish != psVar5)) {
    lVar10 = (long)iVar2;
    local_58 = 1;
    lVar8 = 8;
    do {
      puVar1 = *(undefined4 **)((long)psVar5 + lVar8 + -8);
      this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                 ((long)&(psVar5->
                         super___shared_ptr<cursespp::ShortcutsWindow::Entry,_(__gnu_cxx::_Lock_policy)2>
                         )._M_ptr + lVar8);
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
      uVar9 = *(ulong *)(puVar1 + 0x12);
      if (uVar9 == 0xffffffffffffffff) {
        uVar9 = 0x1200;
      }
      __n = *(size_t *)(puVar1 + 4);
      local_b8 = lVar10;
      if ((__n == (local_c8->activeKey)._M_string_length) &&
         ((__n == 0 ||
          (iVar2 = bcmp((((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (puVar1 + 2))->_M_dataplus)._M_p,(local_c8->activeKey)._M_dataplus._M_p,__n
                       ), iVar2 == 0)))) {
        uVar9 = 0x1300;
      }
      if (local_68 != 0) {
        wprintw();
      }
      local_b8 = local_b8 - 1;
      if (local_b8 == 0) {
        lVar10 = 0;
      }
      else {
        local_60 = this_00;
        std::operator+(&local_e8," ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (puVar1 + 2));
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_e8);
        local_90._M_allocated_capacity = (size_type)&local_80;
        paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(plVar4 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar4 == paVar6) {
          local_80._M_allocated_capacity = paVar6->_M_allocated_capacity;
          local_80._8_8_ = plVar4[3];
        }
        else {
          local_80._M_allocated_capacity = paVar6->_M_allocated_capacity;
          local_90._M_allocated_capacity =
               (size_type)
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*plVar4;
        }
        local_90._8_8_ = plVar4[1];
        *plVar4 = (long)paVar6;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,
                          CONCAT44(local_e8.field_2._M_allocated_capacity._4_4_,
                                   local_e8.field_2._M_allocated_capacity._0_4_) + 1);
        }
        std::operator+(&local_e8," ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (puVar1 + 10));
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_e8);
        local_b0._0_8_ = local_b0 + 0x10;
        bVar7.container =
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             (plVar4 + 2);
        if ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)*plVar4 ==
            bVar7.container) {
          local_b0._16_8_ = ((bVar7.container)->_M_dataplus)._M_p;
          local_b0._24_8_ = plVar4[3];
        }
        else {
          local_b0._16_8_ = ((bVar7.container)->_M_dataplus)._M_p;
          local_b0._0_8_ =
               (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)*plVar4
          ;
        }
        local_b0._8_8_ = plVar4[1];
        *plVar4 = (long)bVar7.container;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,
                          CONCAT44(local_e8.field_2._M_allocated_capacity._4_4_,
                                   local_e8.field_2._M_allocated_capacity._0_4_) + 1);
        }
        std::operator+(&local_50,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_90,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0
                      );
        local_e8._M_string_length = 0;
        local_e8.field_2._M_allocated_capacity._0_4_ = 0;
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
        utf8::
        utf8to16<std::back_insert_iterator<std::__cxx11::wstring>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((utf8 *)local_50._M_dataplus._M_p,
                   (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )(local_50._M_dataplus._M_p + (long)(_Alloc_hider *)local_50._M_string_length),
                   (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )&local_e8,bVar7);
        uVar3 = wcswidth((wchar_t *)local_e8._M_dataplus._M_p,local_e8._M_string_length);
        local_c0 = (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                   local_50._M_string_length;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,
                          CONCAT44(local_e8.field_2._M_allocated_capacity._4_4_,
                                   local_e8.field_2._M_allocated_capacity._0_4_) * 4 + 4);
        }
        bVar7.container = local_c0;
        if (0 < (int)uVar3) {
          bVar7.container =
               (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               (ulong)uVar3;
        }
        local_c0 = bVar7.container;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        *puVar1 = (int)local_70;
        puVar1[1] = (int)local_c0;
        local_e8._M_string_length = 0;
        local_e8.field_2._M_allocated_capacity._0_4_ = 0;
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
        utf8::
        utf8to16<std::back_insert_iterator<std::__cxx11::wstring>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((utf8 *)local_90._M_allocated_capacity,
                   (char *)(local_90._8_8_ + local_90._M_allocated_capacity),
                   (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )&local_e8,bVar7);
        uVar3 = wcswidth((wchar_t *)local_e8._M_dataplus._M_p,local_e8._M_string_length);
        uVar11 = local_90._8_8_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,
                          CONCAT44(local_e8.field_2._M_allocated_capacity._4_4_,
                                   local_e8.field_2._M_allocated_capacity._0_4_) * 4 + 4);
        }
        uVar12 = local_b8;
        if (0 < (int)uVar3) {
          uVar11 = (ulong)uVar3;
        }
        if (local_b8 < (ulong)uVar11) {
          text::Ellipsize(&local_e8,(string *)&local_90,local_b8);
          std::__cxx11::string::operator=((string *)&local_90,(string *)&local_e8);
          uVar11 = uVar12;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
            operator_delete(local_e8._M_dataplus._M_p,
                            CONCAT44(local_e8.field_2._M_allocated_capacity._4_4_,
                                     local_e8.field_2._M_allocated_capacity._0_4_) + 1);
          }
        }
        lVar10 = local_68;
        wattr_on(local_68,uVar9 & 0xffffffff,0);
        if (lVar10 != 0) {
          wprintw(lVar10,"%s",local_90._M_allocated_capacity);
        }
        wattr_off(lVar10,uVar9 & 0xffffffff,0);
        uVar9 = local_b8 - uVar11;
        if (uVar9 == 0) {
          lVar10 = 0;
        }
        else {
          local_e8._M_string_length = 0;
          local_e8.field_2._M_allocated_capacity._0_4_ = 0;
          local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
          utf8::
          utf8to16<std::back_insert_iterator<std::__cxx11::wstring>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                    ((utf8 *)local_b0._0_8_,(char *)(local_b0._0_8_ + local_b0._8_8_),
                     (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )&local_e8,bVar7);
          uVar3 = wcswidth((wchar_t *)local_e8._M_dataplus._M_p,local_e8._M_string_length);
          uVar12 = local_b0._8_8_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
            operator_delete(local_e8._M_dataplus._M_p,
                            CONCAT44(local_e8.field_2._M_allocated_capacity._4_4_,
                                     local_e8.field_2._M_allocated_capacity._0_4_) * 4 + 4);
          }
          if (0 < (int)uVar3) {
            uVar12 = (ulong)uVar3;
          }
          if (uVar9 < uVar12) {
            text::Ellipsize(&local_e8,(string *)local_b0,uVar9);
            std::__cxx11::string::operator=((string *)local_b0,(string *)&local_e8);
            uVar12 = uVar9;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
              operator_delete(local_e8._M_dataplus._M_p,
                              CONCAT44(local_e8.field_2._M_allocated_capacity._4_4_,
                                       local_e8.field_2._M_allocated_capacity._0_4_) + 1);
            }
          }
          if (local_68 != 0) {
            wprintw(local_68,"%s",local_b0._0_8_);
          }
          lVar10 = uVar9 - uVar12;
        }
        if ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
            local_b0._0_8_ !=
            (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
            (local_b0 + 0x10)) {
          operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_allocated_capacity != &local_80) {
          operator_delete((void *)local_90._M_allocated_capacity,local_80._M_allocated_capacity + 1)
          ;
        }
        local_70 = (long)&(local_c0->_M_dataplus)._M_p + local_70 + 1;
        this_00 = local_60;
      }
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      if (lVar10 == 0) {
        return;
      }
      psVar5 = (local_c8->entries).
               super__Vector_base<std::shared_ptr<cursespp::ShortcutsWindow::Entry>,_std::allocator<std::shared_ptr<cursespp::ShortcutsWindow::Entry>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar8 = lVar8 + 0x10;
      bVar13 = local_58 <
               (ulong)((long)(local_c8->entries).
                             super__Vector_base<std::shared_ptr<cursespp::ShortcutsWindow::Entry>,_std::allocator<std::shared_ptr<cursespp::ShortcutsWindow::Entry>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)psVar5 >> 4);
      local_58 = local_58 + 1;
    } while (bVar13);
  }
  return;
}

Assistant:

void ShortcutsWindow::OnRedraw() {
    this->Clear();

    Color normalAttrs = Color(Color::ButtonDefault);
    Color activeAttrs = Color(Color::ButtonHighlighted);

    WINDOW* c = this->GetContent();

    size_t leftPadding = this->CalculateLeftPadding();
    wmove(c, 0, leftPadding);

    size_t currentX = leftPadding;
    size_t remaining = this->GetContentWidth();
    for (size_t i = 0; i < this->entries.size() && remaining > 0; i++) {
        auto e = this->entries[i];

        int64_t keyAttrs = (e->attrs == -1) ? normalAttrs : e->attrs;
        keyAttrs = (e->key == this->activeKey) ? activeAttrs : keyAttrs;

        checked_wprintw(c, " ");
        --remaining;

        if (remaining == 0) {
            continue;
        }

        std::string key = " " + e->key + " ";
        std::string value = " " + e->description + " ";

        /* calculate the offset and width, this is used for mouse
        click handling! */
        size_t width = u8cols(key + value);
        e->position.offset = currentX;
        e->position.width = width;
        currentX += 1 + width; /* 1 is the extra leading space */

        /* draw the shortcut key */
        size_t len = u8cols(key);
        if (len > remaining) {
            key = text::Ellipsize(key, remaining);
            len = remaining;
        }

        wattron(c, keyAttrs);
        checked_wprintw(c, "%s", key.c_str());
        wattroff(c, keyAttrs);

        remaining -= len;

        if (remaining == 0) {
            continue;
        }

        /* draw the description */
        len = u8cols(value);
        if (len > remaining) {
            value = text::Ellipsize(value, remaining);
            len = remaining;
        }

        checked_wprintw(c, "%s", value.c_str());
        remaining -= len;
    }
}